

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O3

AddrOpnd * __thiscall IR::AddrOpnd::CopyInternal(AddrOpnd *this,Func *func)

{
  undefined1 *puVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  AddrOpnd *pAVar5;
  
  if ((this->super_Opnd).m_kind != OpndKindAddr) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                       ,0x8d1,"(m_kind == OpndKindAddr)","m_kind == OpndKindAddr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pAVar5 = New((Var)0x0,this->addrOpndKind,func,(bool)(this->field_0x28 & 1),(Var)0x0);
  pAVar5->m_address = this->m_address;
  (pAVar5->super_Opnd).m_valueType.field_0 = (this->super_Opnd).m_valueType.field_0;
  pAVar5->field_0x28 = pAVar5->field_0x28 & 0xfd | this->field_0x28 & 2;
  pAVar5->m_metadata = this->m_metadata;
  (pAVar5->super_Opnd).m_type = (this->super_Opnd).m_type;
  if (((this->super_Opnd).field_0xb & 1) != 0) {
    puVar1 = &(pAVar5->super_Opnd).field_0xb;
    *puVar1 = *puVar1 | 1;
  }
  pAVar5->decodedValue = this->decodedValue;
  pAVar5->wasVar = this->wasVar;
  return pAVar5;
}

Assistant:

AddrOpnd *
AddrOpnd::CopyInternal(Func *func)
{
    Assert(m_kind == OpndKindAddr);
    AddrOpnd * newOpnd;

    newOpnd = AddrOpnd::New(nullptr, addrOpndKind, func, m_dontEncode);
    // Constructor evaluates address for type, but this is invalid if the address has been encoded, so we wait to set it
    newOpnd->m_address = m_address;
    newOpnd->m_valueType = m_valueType;
    newOpnd->m_isFunction = m_isFunction;
    newOpnd->m_metadata = m_metadata;
    newOpnd->SetType(m_type);
    if (IsValueTypeFixed())
    {
        newOpnd->SetValueTypeFixed();
    }

#if DBG_DUMP || defined(ENABLE_IR_VIEWER)
    newOpnd->decodedValue = this->decodedValue;
    newOpnd->wasVar = this->wasVar;
#endif

    return newOpnd;
}